

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_sequence.hpp
# Opt level: O3

bool jessilib::apply_cpp_escape_sequences<char8_t>
               (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
                *inout_string)

{
  char cVar1;
  bool bVar2;
  undefined1 *puVar3;
  char8_t *pcVar4;
  char8_t *in_RDX;
  char8_t *extraout_RDX;
  difference_type __d;
  ulong uVar5;
  ulong uVar6;
  pointer pcVar7;
  pointer pcVar8;
  ulong uVar9;
  decode_result dVar10;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_01;
  jessilib *local_40;
  char8_t *local_38;
  pointer local_30;
  
  local_40 = (jessilib *)inout_string->_M_string_length;
  if (local_40 == (jessilib *)0x0) {
    bVar2 = true;
  }
  else {
    pcVar8 = (inout_string->_M_dataplus)._M_p;
    in_string._M_str = in_RDX;
    in_string._M_len = (size_t)pcVar8;
    local_38 = pcVar8;
    local_30 = pcVar8;
    dVar10 = decode_codepoint_utf8<char8_t>(local_40,in_string);
    if (dVar10.units != 0) {
      do {
        in_string_00._M_str = (char8_t *)dVar10.units;
        pcVar4 = in_string_00._M_str;
        if (((uint)dVar10.codepoint < 0x5d) && (dVar10.codepoint == L'\\')) {
          in_string_00._M_len = local_38 + (long)in_string_00._M_str;
          local_40 = local_40 + -(long)in_string_00._M_str;
          local_38 = in_string_00._M_len;
          dVar10 = decode_codepoint_utf8<char8_t>(local_40,in_string_00);
          puVar3 = cpp_escapes_main_tree<char8_t>;
          uVar9 = 0x18;
          do {
            uVar5 = uVar9 >> 1;
            uVar6 = uVar5;
            if ((uint)*(char32_t *)((long)puVar3 + uVar5 * 4 * 4) < (uint)dVar10.codepoint) {
              uVar6 = ~uVar5 + uVar9;
              puVar3 = (undefined1 *)((long)puVar3 + (uVar5 * 4 + 4) * 4);
            }
            uVar9 = uVar6;
          } while (0 < (long)uVar6);
          if ((puVar3 != json_object_tree<char16_t,true>) &&
             (*(char32_t *)puVar3 == dVar10.codepoint)) {
            local_38 = local_38 + dVar10.units;
            local_40 = local_40 + -dVar10.units;
            cVar1 = (**(code **)((long)puVar3 + 8))(&local_30,&local_40);
            in_string_00._M_str = extraout_RDX;
            if (cVar1 != '\0') goto LAB_001890b1;
          }
          pcVar7 = (inout_string->_M_dataplus)._M_p;
          uVar9 = (long)local_30 - (long)pcVar7;
          if (inout_string->_M_string_length < uVar9) goto LAB_00189131;
          inout_string->_M_string_length = uVar9;
          pcVar7 = pcVar7 + uVar9;
          bVar2 = false;
          goto LAB_001890ff;
        }
        do {
          *local_30 = *local_38;
          local_30 = local_30 + 1;
          local_38 = local_38 + 1;
          pcVar4 = pcVar4 + -1;
        } while (pcVar4 != (char8_t *)0x0);
        local_40 = local_40 + -(long)in_string_00._M_str;
LAB_001890b1:
        in_string_01._M_str = in_string_00._M_str;
        in_string_01._M_len = (size_t)local_38;
        dVar10 = decode_codepoint_utf8<char8_t>(local_40,in_string_01);
        pcVar8 = local_30;
      } while (dVar10.units != 0);
    }
    pcVar7 = (inout_string->_M_dataplus)._M_p;
    uVar9 = (long)pcVar8 - (long)pcVar7;
    if (inout_string->_M_string_length < uVar9) {
LAB_00189131:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                 uVar9);
    }
    inout_string->_M_string_length = uVar9;
    pcVar7 = pcVar7 + uVar9;
    bVar2 = true;
LAB_001890ff:
    *pcVar7 = '\0';
  }
  return bVar2;
}

Assistant:

constexpr bool apply_cpp_escape_sequences(std::basic_string<CharT>& inout_string) {
	static_assert(is_sorted<CharT, cpp_escapes_root_tree<CharT>, std::size(cpp_escapes_root_tree<CharT>)>(), "Tree must be pre-sorted");
	static_assert(is_sorted<CharT, cpp_escapes_main_tree<CharT>, std::size(cpp_escapes_main_tree<CharT>)>(), "Tree must be pre-sorted");

	return apply_shrink_sequence_tree<CharT, cpp_escapes_root_tree<CharT>, std::size(cpp_escapes_root_tree<CharT>)>(inout_string);
}